

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int loadlib(lua_State *L)

{
  char *k;
  int iVar1;
  lua_State *L_00;
  long lVar2;
  
  L_00 = getstate(L);
  luaL_requiref(L_00,"package",luaopen_package,0);
  iVar1 = lua_type(L_00,-1);
  if (iVar1 != 5) {
    __assert_fail("lua_type(L1, -1) == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x3f7,"int loadlib(lua_State *)");
  }
  luaL_requiref(L_00,"package",(lua_CFunction)0x0,1);
  iVar1 = lua_compare(L_00,-1,-2,0);
  if (iVar1 != 0) {
    luaL_getsubtable(L_00,-0xf4628,"_PRELOAD");
    for (lVar2 = 8; lVar2 != 0x98; lVar2 = lVar2 + 0x10) {
      k = *(char **)((long)&tests_funcs[0x25].func + lVar2);
      lua_pushcclosure(L_00,*(lua_CFunction *)((long)&loadlib::libs[0].name + lVar2),0);
      lua_setfield(L_00,-2,k);
    }
    return 0;
  }
  __assert_fail("lua_compare(L1, -1, -2, 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x3fb,"int loadlib(lua_State *)");
}

Assistant:

static int loadlib (lua_State *L) {
  static const luaL_Reg libs[] = {
    {"_G", luaopen_base},
    {"coroutine", luaopen_coroutine},
    {"debug", luaopen_debug},
    {"io", luaopen_io},
    {"os", luaopen_os},
    {"math", luaopen_math},
    {"string", luaopen_string},
    {"table", luaopen_table},
    {"T", luaB_opentests},
    {NULL, NULL}
  };
  lua_State *L1 = getstate(L);
  int i;
  luaL_requiref(L1, "package", luaopen_package, 0);
  lua_assert(lua_type(L1, -1) == LUA_TTABLE);
  /* 'requiref' should not reload module already loaded... */
  luaL_requiref(L1, "package", NULL, 1);  /* seg. fault if it reloads */
  /* ...but should return the same module */
  lua_assert(lua_compare(L1, -1, -2, LUA_OPEQ));
  luaL_getsubtable(L1, LUA_REGISTRYINDEX, LUA_PRELOAD_TABLE);
  for (i = 0; libs[i].name; i++) {
    lua_pushcfunction(L1, libs[i].func);
    lua_setfield(L1, -2, libs[i].name);
  }
  return 0;
}